

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

uint __thiscall LinearScan::GetSpillCost(LinearScan *this,Lifetime *lifetime)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  undefined4 *puVar9;
  uint lifetimeHelperLength;
  uint totalOpHelperVisitedLength;
  uint length;
  uint lifetimeTotalOpHelperFullVisitedLength;
  uint end;
  uint start;
  uint localUseCost;
  uint spillCost;
  uint useCount;
  Lifetime *lifetime_local;
  LinearScan *this_local;
  
  _spillCost = lifetime;
  lifetime_local = (Lifetime *)this;
  localUseCost = Lifetime::GetRegionUseCount(lifetime,this->curLoop);
  end = GetUseSpillCost(this->loopNest,0);
  if ((_spillCost->reg != RegNOREG) && ((*(ushort *)&_spillCost->field_0x9c & 1) == 0)) {
    uVar4 = end;
    if (_spillCost->allDefsCost <= end) {
      uVar4 = _spillCost->allDefsCost;
    }
    localUseCost = uVar4 + localUseCost;
    if (((this->curLoop != (Loop *)0x0) && (bVar2 = StackSym::IsConst(_spillCost->sym), !bVar2)) &&
       (BVar3 = BVSparse<Memory::JitArenaAllocator>::Test
                          ((this->curLoop->regAlloc).liveOnBackEdgeSyms,
                           (_spillCost->sym->super_Sym).m_id), BVar3 != '\0')) {
      localUseCost = end + localUseCost;
    }
  }
  lifetimeTotalOpHelperFullVisitedLength = IR::Instr::GetNumber(this->currentInstr);
  puVar8 = max<unsigned_int>(&lifetimeTotalOpHelperFullVisitedLength,&_spillCost->end);
  length = *puVar8;
  totalOpHelperVisitedLength = _spillCost->totalOpHelperLengthByEnd;
  if ((this->curLoop != (Loop *)0x0) && ((this->curLoop->regAlloc).loopEnd < length)) {
    uVar4 = Func::GetSourceContextId(this->func);
    uVar5 = Func::GetLocalFunctionId(this->func);
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,RegionUseCountPhase,uVar4,uVar5);
    if (!bVar2) {
      length = (this->curLoop->regAlloc).loopEnd;
      totalOpHelperVisitedLength = (this->curLoop->regAlloc).helperLength;
    }
  }
  uVar6 = (length - lifetimeTotalOpHelperFullVisitedLength) + 1;
  uVar4 = this->totalOpHelperFullVisitedLength;
  uVar5 = CurrentOpHelperVisitedLength(this,this->currentInstr);
  uVar7 = uVar4 + uVar5;
  if (totalOpHelperVisitedLength < uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xdfd,
                       "(lifetimeTotalOpHelperFullVisitedLength >= totalOpHelperVisitedLength)",
                       "lifetimeTotalOpHelperFullVisitedLength >= totalOpHelperVisitedLength");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  uVar7 = totalOpHelperVisitedLength - uVar7;
  if (uVar6 < uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0xdff,"(length >= lifetimeHelperLength)","length >= lifetimeHelperLength");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar9 = 0;
  }
  lifetimeHelperLength = uVar6 - uVar7;
  if (lifetimeHelperLength == 0) {
    lifetimeHelperLength = 1;
  }
  start = (localUseCost << 0xd) / (lifetimeHelperLength + 0x40);
  if ((*(ushort *)&_spillCost->field_0x9c >> 9 & 1) != 0) {
    start = (start << 2) / 5;
  }
  if ((*(ushort *)&_spillCost->field_0x9c >> 10 & 1) != 0) {
    start = start >> 1;
  }
  bVar2 = StackSym::IsConst(_spillCost->sym);
  if (bVar2) {
    start = start >> 4;
  }
  return start;
}

Assistant:

uint
LinearScan::GetSpillCost(Lifetime *lifetime)
{
    uint useCount = lifetime->GetRegionUseCount(this->curLoop);
    uint spillCost;
    // Get local spill cost.  Ignore helper blocks as we'll also need compensation on the main path.
    uint localUseCost = LinearScan::GetUseSpillCost(this->loopNest, false);

    if (lifetime->reg && !lifetime->isSpilled)
    {
        // If it is in a reg, we'll need a store
        if (localUseCost >= lifetime->allDefsCost)
        {
            useCount += lifetime->allDefsCost;
        }
        else
        {
            useCount += localUseCost;
        }

        if (this->curLoop && !lifetime->sym->IsConst()
            && this->curLoop->regAlloc.liveOnBackEdgeSyms->Test(lifetime->sym->m_id))
        {
            // If we spill here, we'll need to insert a load at the bottom of the loop
            // (it would be nice to be able to check is was in a reg at the top of the loop)...
            useCount += localUseCost;
        }
    }

    // When comparing 2 lifetimes, we don't really care about the actual length of the lifetimes.
    // What matters is how much longer will they use the register.
    const uint start = currentInstr->GetNumber();
    uint end = max(start, lifetime->end);
    uint lifetimeTotalOpHelperFullVisitedLength = lifetime->totalOpHelperLengthByEnd;

    if (this->curLoop && this->curLoop->regAlloc.loopEnd < end && !PHASE_OFF(Js::RegionUseCountPhase, this->func))
    {
        end = this->curLoop->regAlloc.loopEnd;
        lifetimeTotalOpHelperFullVisitedLength  = this->curLoop->regAlloc.helperLength;
    }
    uint length = end - start + 1;

    // Exclude helper block length since helper block paths are typically infrequently taken paths and not as important
    const uint totalOpHelperVisitedLength = this->totalOpHelperFullVisitedLength + CurrentOpHelperVisitedLength(currentInstr);
    Assert(lifetimeTotalOpHelperFullVisitedLength >= totalOpHelperVisitedLength);
    const uint lifetimeHelperLength = lifetimeTotalOpHelperFullVisitedLength - totalOpHelperVisitedLength;
    Assert(length >= lifetimeHelperLength);
    length -= lifetimeHelperLength;
    if(length == 0)
    {
        length = 1;
    }

    // Add a base length so that the difference between a length of 1 and a length of 2 is not so large
#ifdef _M_X64
    length += 64;
#else
    length += 16;
#endif

    spillCost = (useCount << 13) / length;

    if (lifetime->isSecondChanceAllocated)
    {
        // Second chance allocation have additional overhead, so de-prioritize them
        // Note: could use more tuning...
        spillCost = spillCost * 4/5;
    }
    if (lifetime->isCheapSpill)
    {
        // This lifetime will get spilled eventually, so lower the spill cost to favor other lifetimes
        // Note: could use more tuning...
        spillCost /= 2;
    }

    if (lifetime->sym->IsConst())
    {
        spillCost = spillCost / 16;
    }

    return spillCost;
}